

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

int __thiscall
CVmObjDict::match_strings
          (CVmObjDict *this,vm_val_t *valstrval,char *valstr,size_t vallen,char *refstr,
          size_t reflen,vm_val_t *result_val)

{
  char *pcVar1;
  long *plVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  vm_val_t cobj_val;
  vm_rcdesc rc;
  
  pvVar5 = sp_;
  pcVar1 = (this->super_CVmObject).ext_;
  iVar6 = *(int *)(pcVar1 + 0x30);
  if (iVar6 == 2) {
    sp_ = sp_ + 1;
    vVar7 = CVmObjString::create(0,refstr,reflen);
    pvVar5->typ = VM_OBJ;
    (pvVar5->val).obj = vVar7;
    pvVar5 = sp_;
    if (valstrval == (vm_val_t *)0x0) {
      sp_ = sp_ + 1;
      vVar7 = CVmObjString::create(0,valstr,vallen);
      pvVar5->typ = VM_OBJ;
      (pvVar5->val).obj = vVar7;
    }
    else {
      uVar4 = *(undefined4 *)&valstrval->field_0x4;
      aVar3 = valstrval->val;
      sp_ = sp_ + 1;
      pvVar5->typ = valstrval->typ;
      *(undefined4 *)&pvVar5->field_0x4 = uVar4;
      pvVar5->val = aVar3;
    }
    vm_rcdesc::init_ret(&rc,"HashComparator.matchValues");
    cobj_val.val.obj = *(undefined4 *)((this->super_CVmObject).ext_ + 0x20);
    cobj_val.typ = VM_OBJ;
    CVmRun::get_prop(&G_interpreter_X,0,&cobj_val,G_predef_X.match_values_prop,&cobj_val,2,&rc);
    aVar3 = r0_.val;
    uVar4 = r0_._4_4_;
    result_val->typ = r0_.typ;
    *(undefined4 *)&result_val->field_0x4 = uVar4;
    result_val->val = aVar3;
    if (result_val->typ == VM_NIL) {
      return 0;
    }
    if (result_val->typ == VM_INT) {
      return (uint)((result_val->val).obj != 0);
    }
  }
  else {
    if (iVar6 == 1) {
      plVar2 = *(long **)(pcVar1 + 0x28);
      vVar7 = (**(code **)(*plVar2 + 0x1e0))(plVar2,valstr,vallen,refstr,reflen);
      result_val->typ = VM_INT;
      (result_val->val).obj = vVar7;
      return vVar7;
    }
    if (iVar6 != 0) {
      return 0;
    }
    if ((vallen != reflen) || (iVar6 = bcmp(valstr,refstr,vallen), iVar6 != 0)) {
      result_val->typ = VM_INT;
      (result_val->val).obj = 0;
      return 0;
    }
    result_val->typ = VM_INT;
    (result_val->val).obj = 1;
  }
  return 1;
}

Assistant:

int CVmObjDict::match_strings(VMG_ const vm_val_t *valstrval,
                              const char *valstr, size_t vallen,
                              const char *refstr, size_t reflen,
                              vm_val_t *result_val)
{
    vm_val_t cobj_val;

    /* check what kind of comparator we have */
    switch(get_ext()->comparator_type_)
    {
    case VMDICT_COMP_NONE:
        /* no comparator - compare the strings byte-for-byte */
        if (vallen == reflen && memcmp(valstr, refstr, vallen) == 0)
        {
            /* match - return true */
            result_val->set_int(1);
            return TRUE;
        }
        else
        {
            /* no match - return false */
            result_val->set_int(0);
            return FALSE;
        }

    case VMDICT_COMP_STRCOMP:
        /* match the value directly with the StringComparator */
        result_val->set_int(
            ((CVmObjStrComp *)get_ext()->comparator_obj_)->match_strings(
                valstr, vallen, refstr, reflen));
        
        /* we matched if the result was non-zero */
        return result_val->val.intval;

    case VMDICT_COMP_GENERIC:
        /* 2nd param: push the reference string, as a string object */
        G_stk->push()->set_obj(
            CVmObjString::create(vmg_ FALSE, refstr, reflen));
        
        /* 1st param: push the value string */
        if (valstrval != 0)
        {
            /* push the value string as given */
            G_stk->push(valstrval);
        }
        else
        {
            /* no value string was given - create one and push it */
            G_stk->push()->set_obj(
                CVmObjString::create(vmg_ FALSE, valstr, vallen));
        }

        {
            /* set up a recursive call context */
            vm_rcdesc rc;
            rc.init_ret(vmg_ "HashComparator.matchValues");

            /* call the comparator's matchValues method */
            cobj_val.set_obj(get_ext()->comparator_);
            G_interpreter->get_prop(vmg_ 0, &cobj_val,
                                    G_predef->match_values_prop, &cobj_val, 2,
                                    &rc);
        }

        /* get the result from R0 */
        *result_val = *G_interpreter->get_r0();

        /* we matched if the result isn't 0 or nil */
        return !(result_val->typ == VM_NIL
                 || (result_val->typ == VM_INT
                     && result_val->val.intval == 0));
    }

    /* we should never get here, but just in case... */
    return FALSE;
}